

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O0

uint64_t __thiscall TxReconciliationTracker::Impl::PreRegisterPeer(Impl *this,NodeId peer_id)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  uint64_t uVar3;
  ConstevalFormatString<1U> in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  long *in_stack_00000050;
  uint64_t local_salt;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  FastRandomContext *in_stack_fffffffffffffea8;
  FastRandomContext *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffed8;
  LogFlags in_stack_ffffffffffffff00;
  int source_line;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  string_view in_stack_ffffffffffffff60;
  
  source_line = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
             (Mutex *)0x4e591b);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffed8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
             ,in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea8 = (FastRandomContext *)&stack0xffffffffffffff48;
    in_stack_fffffffffffffea0 = "Pre-register peer=%d\n";
    in_stack_fffffffffffffe98 = 1;
    source_file._M_str._0_1_ = in_stack_ffffffffffffff58;
    source_file._M_len = in_stack_ffffffffffffff50;
    source_file._M_str._1_7_ = in_stack_ffffffffffffff59;
    LogPrintFormatInternal<long>
              (in_stack_ffffffffffffff60,source_file,source_line,in_stack_ffffffffffffff00,
               in_stack_00000040,in_RSI,in_stack_00000050);
  }
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffea8,SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
  uVar3 = FastRandomContext::rand64(in_stack_fffffffffffffeb0);
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::
  unordered_map<long,std::variant<unsigned_long,(anonymous_namespace)::TxReconciliationState>,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,std::variant<unsigned_long,(anonymous_namespace)::TxReconciliationState>>>>
  ::emplace<long&,unsigned_long_const&>
            ((unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
              *)in_stack_fffffffffffffeb8,(long *)in_stack_fffffffffffffeb0,
             (unsigned_long *)in_stack_fffffffffffffea8);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0,
             (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Pre-register peer=%d\n", peer_id);
        const uint64_t local_salt{FastRandomContext().rand64()};

        // We do this exactly once per peer (which are unique by NodeId, see GetNewNodeId) so it's
        // safe to assume we don't have this record yet.
        Assume(m_states.emplace(peer_id, local_salt).second);
        return local_salt;
    }